

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O0

void __thiscall t_program::set_out_path(t_program *this,string *out_path,bool out_path_is_absolute)

{
  char *pcVar1;
  char c;
  bool out_path_is_absolute_local;
  string *out_path_local;
  t_program *this_local;
  
  std::__cxx11::string::operator=((string *)&this->out_path_,(string *)out_path);
  this->out_path_is_absolute_ = out_path_is_absolute;
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::at((ulong)&this->out_path_);
  if ((*pcVar1 != '/') && (*pcVar1 != '\\')) {
    std::__cxx11::string::push_back((char)this + 'p');
  }
  return;
}

Assistant:

void set_out_path(std::string out_path, bool out_path_is_absolute) {
    out_path_ = out_path;
    out_path_is_absolute_ = out_path_is_absolute;
    // Ensure that it ends with a trailing '/' (or '\' for windows machines)
    char c = out_path_.at(out_path_.size() - 1);
    if (!(c == '/' || c == '\\')) {
      out_path_.push_back('/');
    }
  }